

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testclip.cpp
# Opt level: O3

void test_region_fns(void)

{
  int iVar1;
  bool bVar2;
  long *plVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  undefined1 *puVar8;
  Am_Style local_70 [8];
  Am_Style local_68 [8];
  Am_Style local_60 [8];
  Am_Style local_58 [8];
  Am_Style local_50 [8];
  Am_Style local_48 [8];
  Am_Style local_40 [8];
  Am_Style local_38 [8];
  
  puts("Testing low-level Am_Region member functions:");
  printf("  Hit RETURN to clip giant black rect to an Am_Region:");
  getchar();
  (**(code **)(*(long *)d1 + 0xe8))();
  (**(code **)(*(long *)d1 + 0x98))(d1,0,0,*(undefined4 *)(d1 + 0x10),*(undefined4 *)(d1 + 0x14));
  plVar3 = (long *)Am_Region::Create();
  (**(code **)(*plVar3 + 0x30))(plVar3,0x96,0x32,0x50,0x28);
  (**(code **)(*(long *)d1 + 0xf0))(d1,plVar3);
  (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&black,0,0,300,200,0);
  (**(code **)(*(long *)d1 + 0xa0))();
  (**(code **)(*plVar3 + 8))(plVar3);
  printf("  Hit RETURN 6 times to nest Am_Region clipping:  ");
  Am_Style::Am_Style(local_48,(Am_Style *)&red);
  Am_Style::Am_Style(local_50,(Am_Style *)&green);
  Am_Style::Am_Style(local_58,(Am_Style *)&blue);
  Am_Style::Am_Style(local_60,(Am_Style *)&white);
  Am_Style::Am_Style(local_68,(Am_Style *)&black);
  Am_Style::Am_Style(local_70,(Am_Style *)&yellow);
  Am_Style::Am_Style(local_38,(Am_Style *)&Am_No_Style);
  Am_Style::Am_Style(local_40,(Am_Style *)&Am_No_Style);
  set_style_array(local_48,local_50,local_58,local_60,local_68,local_70,local_38,local_40);
  Am_Style::~Am_Style(local_40);
  Am_Style::~Am_Style(local_38);
  Am_Style::~Am_Style(local_70);
  Am_Style::~Am_Style(local_68);
  Am_Style::~Am_Style(local_60);
  Am_Style::~Am_Style(local_58);
  Am_Style::~Am_Style(local_50);
  Am_Style::~Am_Style(local_48);
  (**(code **)(*(long *)d1 + 0x98))(d1,0,0,*(undefined4 *)(d1 + 0x10),*(undefined4 *)(d1 + 0x14));
  iVar5 = 10;
  puVar8 = style_array;
  lVar7 = -6;
  plVar3 = (long *)Am_Region::Create();
  do {
    getchar();
    printf("%d  ",(ulong)((int)lVar7 + 7));
    (**(code **)(*plVar3 + 0x40))(plVar3,iVar5,iVar5,0x96,0x96);
    (**(code **)(*(long *)d1 + 0xf0))(d1,plVar3);
    (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,puVar8,0,0,300,200,0);
    (**(code **)(*(long *)d1 + 0xa0))();
    iVar5 = iVar5 + 10;
    puVar8 = puVar8 + 8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 0);
  putchar(10);
  printf("  Hit RETURN 6 times to pop Am_Region clipping:  ");
  uVar6 = 1;
  do {
    getchar();
    printf("%d  ",(ulong)uVar6);
    (**(code **)(*plVar3 + 0x48))(plVar3);
    (**(code **)(*(long *)d1 + 0xf0))(d1,plVar3);
    (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,&purple,0,0,300,200,0);
    (**(code **)(*(long *)d1 + 0xa0))();
    uVar6 = uVar6 + 1;
  } while (uVar6 != 7);
  putchar(10);
  iVar5 = 0;
  printf("  Hit RETURN 2 times to push again onto that same Am_Region:  ");
  bVar2 = true;
  do {
    bVar4 = bVar2;
    getchar();
    printf("%d  ",(ulong)(iVar5 + 1));
    iVar1 = iVar5 * 10 + 0x32;
    (**(code **)(*plVar3 + 0x40))(plVar3,iVar1,iVar1,200,0x32);
    (**(code **)(*(long *)d1 + 0xf0))(d1,plVar3);
    (**(code **)(*(long *)d1 + 0x160))(d1,&Am_No_Style,iVar5 * 8 + 0x107180,0,0,300,200,0);
    (**(code **)(*(long *)d1 + 0xa0))();
    iVar5 = 1;
    bVar2 = false;
  } while (bVar4);
  putchar(10);
  return;
}

Assistant:

void
test_region_fns()
{
  printf("Testing low-level Am_Region member functions:\n");

  printf("  Hit RETURN to clip giant black rect to an Am_Region:");
  getchar();

  d1->Clear_Clip();
  clear_whole_window(d1);
  ;

  Am_Region *rgn = Am_Region::Create();
  rgn->Set(150, 50, 80, 40);
  d1->Set_Clip(rgn);
  d1->Draw_Rectangle(Am_No_Style, black, 0, 0, 300, 200);
  d1->Flush_Output();
  rgn->Destroy();

  int counter;
  printf("  Hit RETURN 6 times to nest Am_Region clipping:  ");
  set_style_array(red, green, blue, white, black, yellow);
  clear_whole_window(d1);
  ;

  rgn = Am_Region::Create();
  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    rgn->Push(10 + 10 * counter, 10 + 10 * counter, 150, 150);
    d1->Set_Clip(rgn);
    d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");

  printf("  Hit RETURN 6 times to pop Am_Region clipping:  ");
  for (counter = 0; counter <= 5; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    rgn->Pop();
    d1->Set_Clip(rgn);
    d1->Draw_Rectangle(Am_No_Style, purple, 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");

  printf("  Hit RETURN 2 times to push again onto that same Am_Region:  ");
  for (counter = 0; counter <= 1; counter++) {
    getchar();
    printf("%d  ", counter + 1);
    rgn->Push(50 + 10 * counter, 50 + 10 * counter, 200, 50);
    d1->Set_Clip(rgn);
    d1->Draw_Rectangle(Am_No_Style, style_array[counter], 0, 0, 300, 200);
    d1->Flush_Output();
  }
  printf("\n");
}